

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  StackItemT<embree::NodeRefPtr<4>_> SVar6;
  StackItemT<embree::NodeRefPtr<4>_> SVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar11;
  int iVar12;
  RTCRayN *pRVar13;
  Scene *pSVar14;
  ulong uVar15;
  undefined4 uVar16;
  ulong unaff_RBP;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  long lVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 extraout_var [56];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [16];
  undefined1 local_12e1;
  ulong local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  undefined1 local_12c8 [16];
  undefined8 local_12b8;
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [16];
  vbool<4> valid;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 *local_1248;
  ulong local_1240;
  ulong local_1238;
  ulong local_1230;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1098;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar23 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_10b8._4_4_ = uVar16;
  local_10b8._0_4_ = uVar16;
  local_10b8._8_4_ = uVar16;
  local_10b8._12_4_ = uVar16;
  auVar87 = ZEXT1664(local_10b8);
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10c8._4_4_ = uVar16;
  local_10c8._0_4_ = uVar16;
  local_10c8._8_4_ = uVar16;
  local_10c8._12_4_ = uVar16;
  auVar88 = ZEXT1664(local_10c8);
  uVar16 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10d8._4_4_ = uVar16;
  local_10d8._0_4_ = uVar16;
  local_10d8._8_4_ = uVar16;
  local_10d8._12_4_ = uVar16;
  auVar91 = ZEXT1664(local_10d8);
  local_1118 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1128 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1138 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_10e8 = local_1118 * 0.99999964;
  local_10f8 = local_1128 * 0.99999964;
  local_1108 = local_1138 * 0.99999964;
  local_1118 = local_1118 * 1.0000004;
  local_1128 = local_1128 * 1.0000004;
  local_1138 = local_1138 * 1.0000004;
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1238 = uVar18 ^ 0x10;
  local_1240 = uVar21 ^ 0x10;
  local_1230 = uVar22 ^ 0x10;
  iVar12 = (tray->tnear).field_0.i[k];
  auVar75._4_4_ = iVar12;
  auVar75._0_4_ = iVar12;
  auVar75._8_4_ = iVar12;
  auVar75._12_4_ = iVar12;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar37 = ZEXT1664(CONCAT412(iVar12,CONCAT48(iVar12,CONCAT44(iVar12,iVar12))));
  local_1248 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  fStack_1124 = local_1128;
  fStack_1120 = local_1128;
  fStack_111c = local_1128;
  fStack_1134 = local_1138;
  fStack_1130 = local_1138;
  fStack_112c = local_1138;
  uVar15 = local_1238;
  uVar27 = local_1240;
  fVar92 = local_10e8;
  fVar95 = local_10e8;
  fVar96 = local_10e8;
  fVar97 = local_10e8;
  fVar98 = local_10f8;
  fVar99 = local_10f8;
  fVar100 = local_10f8;
  fVar101 = local_10f8;
  fVar102 = local_1108;
  fVar103 = local_1108;
  fVar104 = local_1108;
  fVar105 = local_1108;
  fVar108 = local_1118;
  fVar110 = local_1118;
  fVar112 = local_1118;
  fVar114 = local_1118;
  fVar107 = local_1128;
  fVar109 = local_1128;
  fVar111 = local_1128;
  fVar113 = local_1128;
  fVar115 = local_1138;
  fVar117 = local_1138;
  fVar118 = local_1138;
  fVar119 = local_1138;
  local_12e0 = uVar21;
  local_12d8 = uVar18;
  local_12d0 = uVar22;
  do {
    do {
      do {
        if (pSVar23 == stack) {
          return;
        }
        pSVar11 = pSVar23 + -1;
        pSVar23 = pSVar23 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar11->dist);
      sVar26 = (pSVar23->ptr).ptr;
      do {
        if ((sVar26 & 8) == 0) {
          auVar39 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar18),auVar87._0_16_);
          auVar38._0_4_ = fVar92 * auVar39._0_4_;
          auVar38._4_4_ = fVar95 * auVar39._4_4_;
          auVar38._8_4_ = fVar96 * auVar39._8_4_;
          auVar38._12_4_ = fVar97 * auVar39._12_4_;
          auVar39 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar21),auVar88._0_16_);
          auVar49._0_4_ = fVar98 * auVar39._0_4_;
          auVar49._4_4_ = fVar99 * auVar39._4_4_;
          auVar49._8_4_ = fVar100 * auVar39._8_4_;
          auVar49._12_4_ = fVar101 * auVar39._12_4_;
          auVar39 = vmaxps_avx(auVar38,auVar49);
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar22),auVar91._0_16_);
          auVar50._0_4_ = fVar102 * auVar38._0_4_;
          auVar50._4_4_ = fVar103 * auVar38._4_4_;
          auVar50._8_4_ = fVar104 * auVar38._8_4_;
          auVar50._12_4_ = fVar105 * auVar38._12_4_;
          auVar38 = vmaxps_avx(auVar50,auVar75);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar39,auVar38)
          ;
          auVar39 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar15),auVar87._0_16_);
          auVar51._0_4_ = fVar108 * auVar39._0_4_;
          auVar51._4_4_ = fVar110 * auVar39._4_4_;
          auVar51._8_4_ = fVar112 * auVar39._8_4_;
          auVar51._12_4_ = fVar114 * auVar39._12_4_;
          auVar39 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + uVar27),auVar88._0_16_);
          auVar58._0_4_ = fVar107 * auVar39._0_4_;
          auVar58._4_4_ = fVar109 * auVar39._4_4_;
          auVar58._8_4_ = fVar111 * auVar39._8_4_;
          auVar58._12_4_ = fVar113 * auVar39._12_4_;
          auVar39 = vminps_avx(auVar51,auVar58);
          auVar38 = vsubps_avx(*(undefined1 (*) [16])(sVar26 + 0x20 + local_1230),auVar91._0_16_);
          auVar59._0_4_ = fVar115 * auVar38._0_4_;
          auVar59._4_4_ = fVar117 * auVar38._4_4_;
          auVar59._8_4_ = fVar118 * auVar38._8_4_;
          auVar59._12_4_ = fVar119 * auVar38._12_4_;
          auVar38 = vminps_avx(auVar59,auVar37._0_16_);
          auVar39 = vminps_avx(auVar39,auVar38);
          auVar39 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar39,2);
          uVar16 = vmovmskps_avx(auVar39);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar16);
        }
        if ((sVar26 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar12 = 4;
          }
          else {
            uVar25 = sVar26 & 0xfffffffffffffff0;
            lVar20 = 0;
            for (uVar19 = unaff_RBP; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            iVar12 = 0;
            uVar19 = unaff_RBP - 1 & unaff_RBP;
            sVar26 = *(ulong *)(uVar25 + lVar20 * 8);
            if (uVar19 != 0) {
              uVar3 = tNear.field_0.i[lVar20];
              lVar20 = 0;
              for (uVar18 = uVar19; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar19 = uVar19 - 1 & uVar19;
              uVar4 = *(ulong *)(uVar25 + lVar20 * 8);
              uVar2 = tNear.field_0.i[lVar20];
              uVar18 = local_12d8;
              uVar21 = local_12e0;
              uVar22 = local_12d0;
              if (uVar19 == 0) {
                if (uVar3 < uVar2) {
                  (pSVar23->ptr).ptr = uVar4;
                  pSVar23->dist = uVar2;
                  pSVar23 = pSVar23 + 1;
                }
                else {
                  (pSVar23->ptr).ptr = sVar26;
                  pSVar23->dist = uVar3;
                  pSVar23 = pSVar23 + 1;
                  sVar26 = uVar4;
                }
              }
              else {
                auVar39._8_8_ = 0;
                auVar39._0_8_ = sVar26;
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar3));
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar4;
                auVar38 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar2));
                lVar20 = 0;
                for (uVar4 = uVar19; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
                uVar19 = uVar19 - 1 & uVar19;
                auVar60._8_8_ = 0;
                auVar60._0_8_ = *(ulong *)(uVar25 + lVar20 * 8);
                auVar50 = vpunpcklqdq_avx(auVar60,ZEXT416((uint)tNear.field_0.i[lVar20]));
                auVar49 = vpcmpgtd_avx(auVar38,auVar39);
                if (uVar19 == 0) {
                  auVar51 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar38,auVar39,auVar51);
                  auVar39 = vblendvps_avx(auVar39,auVar38,auVar51);
                  auVar38 = vpcmpgtd_avx(auVar50,auVar49);
                  auVar51 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar50,auVar49,auVar51);
                  auVar49 = vblendvps_avx(auVar49,auVar50,auVar51);
                  auVar50 = vpcmpgtd_avx(auVar49,auVar39);
                  auVar50 = vpshufd_avx(auVar50,0xaa);
                  SVar6 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar49,auVar39,auVar50)
                  ;
                  SVar7 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar39,auVar49,auVar50)
                  ;
                  *pSVar23 = SVar7;
                  pSVar23[1] = SVar6;
                  sVar26 = auVar38._0_8_;
                  pSVar23 = pSVar23 + 2;
                }
                else {
                  lVar20 = 0;
                  for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                    lVar20 = lVar20 + 1;
                  }
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = *(ulong *)(uVar25 + lVar20 * 8);
                  auVar58 = vpunpcklqdq_avx(auVar71,ZEXT416((uint)tNear.field_0.i[lVar20]));
                  auVar51 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar38,auVar39,auVar51);
                  auVar39 = vblendvps_avx(auVar39,auVar38,auVar51);
                  auVar38 = vpcmpgtd_avx(auVar58,auVar50);
                  auVar51 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar58,auVar50,auVar51);
                  auVar50 = vblendvps_avx(auVar50,auVar58,auVar51);
                  auVar51 = vpcmpgtd_avx(auVar50,auVar39);
                  auVar58 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar50,auVar39,auVar58);
                  SVar6 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar39,auVar50,auVar58)
                  ;
                  auVar39 = vpcmpgtd_avx(auVar38,auVar49);
                  auVar50 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar38,auVar49,auVar50);
                  auVar38 = vblendvps_avx(auVar49,auVar38,auVar50);
                  auVar49 = vpcmpgtd_avx(auVar51,auVar38);
                  auVar49 = vpshufd_avx(auVar49,0xaa);
                  SVar7 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar51,auVar38,auVar49)
                  ;
                  SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar38,auVar51,auVar49)
                  ;
                  *pSVar23 = SVar6;
                  pSVar23[1] = SVar8;
                  pSVar23[2] = SVar7;
                  sVar26 = auVar39._0_8_;
                  pSVar23 = pSVar23 + 3;
                }
              }
            }
          }
        }
        else {
          iVar12 = 6;
        }
      } while (iVar12 == 0);
    } while (iVar12 != 6);
    uVar15 = (ulong)((uint)sVar26 & 0xf);
    if (uVar15 != 8) {
      uVar27 = sVar26 & 0xfffffffffffffff0;
      lVar20 = 0;
      do {
        lVar24 = lVar20 * 0xb0;
        uVar16 = *(undefined4 *)(ray + k * 4);
        auVar28._4_4_ = uVar16;
        auVar28._0_4_ = uVar16;
        auVar28._8_4_ = uVar16;
        auVar28._12_4_ = uVar16;
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar53._4_4_ = uVar16;
        auVar53._0_4_ = uVar16;
        auVar53._8_4_ = uVar16;
        auVar53._12_4_ = uVar16;
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar61._4_4_ = uVar16;
        auVar61._0_4_ = uVar16;
        auVar61._8_4_ = uVar16;
        auVar61._12_4_ = uVar16;
        auVar49 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + lVar24),auVar28);
        local_1018 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x10 + lVar24),auVar53);
        local_1028 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + lVar24),auVar61);
        auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x30 + lVar24),auVar28);
        auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x40 + lVar24),auVar53);
        auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x50 + lVar24),auVar61);
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x60 + lVar24),auVar28);
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x70 + lVar24),auVar53);
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x80 + lVar24),auVar61);
        local_1038 = vsubps_avx(auVar51,auVar49);
        local_1058 = vsubps_avx(auVar58,local_1018);
        local_1048 = vsubps_avx(auVar59,local_1028);
        auVar29._0_4_ = auVar49._0_4_ + auVar51._0_4_;
        auVar29._4_4_ = auVar49._4_4_ + auVar51._4_4_;
        auVar29._8_4_ = auVar49._8_4_ + auVar51._8_4_;
        auVar29._12_4_ = auVar49._12_4_ + auVar51._12_4_;
        auVar62._0_4_ = local_1018._0_4_ + auVar58._0_4_;
        auVar62._4_4_ = local_1018._4_4_ + auVar58._4_4_;
        auVar62._8_4_ = local_1018._8_4_ + auVar58._8_4_;
        auVar62._12_4_ = local_1018._12_4_ + auVar58._12_4_;
        fVar108 = local_1028._0_4_;
        auVar66._0_4_ = fVar108 + auVar59._0_4_;
        fVar110 = local_1028._4_4_;
        auVar66._4_4_ = fVar110 + auVar59._4_4_;
        fVar112 = local_1028._8_4_;
        auVar66._8_4_ = fVar112 + auVar59._8_4_;
        fVar114 = local_1028._12_4_;
        auVar66._12_4_ = fVar114 + auVar59._12_4_;
        auVar106._0_4_ = local_1048._0_4_ * auVar62._0_4_;
        auVar106._4_4_ = local_1048._4_4_ * auVar62._4_4_;
        auVar106._8_4_ = local_1048._8_4_ * auVar62._8_4_;
        auVar106._12_4_ = local_1048._12_4_ * auVar62._12_4_;
        auVar60 = vfmsub231ps_fma(auVar106,local_1058,auVar66);
        auVar67._0_4_ = auVar66._0_4_ * local_1038._0_4_;
        auVar67._4_4_ = auVar66._4_4_ * local_1038._4_4_;
        auVar67._8_4_ = auVar66._8_4_ * local_1038._8_4_;
        auVar67._12_4_ = auVar66._12_4_ * local_1038._12_4_;
        auVar52 = vfmsub231ps_fma(auVar67,local_1048,auVar29);
        auVar30._0_4_ = local_1058._0_4_ * auVar29._0_4_;
        auVar30._4_4_ = local_1058._4_4_ * auVar29._4_4_;
        auVar30._8_4_ = local_1058._8_4_ * auVar29._8_4_;
        auVar30._12_4_ = local_1058._12_4_ * auVar29._12_4_;
        auVar71 = vfmsub231ps_fma(auVar30,local_1038,auVar62);
        local_12b8._4_4_ = *(float *)(ray + k * 4 + 0x60);
        auVar63._0_4_ = local_12b8._4_4_ * auVar71._0_4_;
        auVar63._4_4_ = local_12b8._4_4_ * auVar71._4_4_;
        auVar63._8_4_ = local_12b8._4_4_ * auVar71._8_4_;
        auVar63._12_4_ = local_12b8._4_4_ * auVar71._12_4_;
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar89._4_4_ = uVar16;
        auVar89._0_4_ = uVar16;
        auVar89._8_4_ = uVar16;
        auVar89._12_4_ = uVar16;
        auVar52 = vfmadd231ps_fma(auVar63,auVar89,auVar52);
        uVar16 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar116._4_4_ = uVar16;
        auVar116._0_4_ = uVar16;
        auVar116._8_4_ = uVar16;
        auVar116._12_4_ = uVar16;
        local_1098 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar52,auVar116,auVar60);
        local_1068 = vsubps_avx(local_1018,auVar38);
        local_1078 = vsubps_avx(local_1028,auVar50);
        auVar72._0_4_ = auVar38._0_4_ + local_1018._0_4_;
        auVar72._4_4_ = auVar38._4_4_ + local_1018._4_4_;
        auVar72._8_4_ = auVar38._8_4_ + local_1018._8_4_;
        auVar72._12_4_ = auVar38._12_4_ + local_1018._12_4_;
        auVar68._0_4_ = fVar108 + auVar50._0_4_;
        auVar68._4_4_ = fVar110 + auVar50._4_4_;
        auVar68._8_4_ = fVar112 + auVar50._8_4_;
        auVar68._12_4_ = fVar114 + auVar50._12_4_;
        fVar92 = local_1078._0_4_;
        auVar76._0_4_ = auVar72._0_4_ * fVar92;
        fVar97 = local_1078._4_4_;
        auVar76._4_4_ = auVar72._4_4_ * fVar97;
        fVar100 = local_1078._8_4_;
        auVar76._8_4_ = auVar72._8_4_ * fVar100;
        fVar103 = local_1078._12_4_;
        auVar76._12_4_ = auVar72._12_4_ * fVar103;
        auVar60 = vfmsub231ps_fma(auVar76,local_1068,auVar68);
        local_1088 = vsubps_avx(auVar49,auVar39);
        fVar95 = local_1088._0_4_;
        auVar82._0_4_ = auVar68._0_4_ * fVar95;
        fVar98 = local_1088._4_4_;
        auVar82._4_4_ = auVar68._4_4_ * fVar98;
        fVar101 = local_1088._8_4_;
        auVar82._8_4_ = auVar68._8_4_ * fVar101;
        fVar104 = local_1088._12_4_;
        auVar82._12_4_ = auVar68._12_4_ * fVar104;
        auVar69._0_4_ = auVar49._0_4_ + auVar39._0_4_;
        auVar69._4_4_ = auVar49._4_4_ + auVar39._4_4_;
        auVar69._8_4_ = auVar49._8_4_ + auVar39._8_4_;
        auVar69._12_4_ = auVar49._12_4_ + auVar39._12_4_;
        auVar52 = vfmsub231ps_fma(auVar82,local_1078,auVar69);
        fVar96 = local_1068._0_4_;
        auVar70._0_4_ = auVar69._0_4_ * fVar96;
        fVar99 = local_1068._4_4_;
        auVar70._4_4_ = auVar69._4_4_ * fVar99;
        fVar102 = local_1068._8_4_;
        auVar70._8_4_ = auVar69._8_4_ * fVar102;
        fVar105 = local_1068._12_4_;
        auVar70._12_4_ = auVar69._12_4_ * fVar105;
        auVar71 = vfmsub231ps_fma(auVar70,local_1088,auVar72);
        auVar31._0_4_ = local_12b8._4_4_ * auVar71._0_4_;
        auVar31._4_4_ = local_12b8._4_4_ * auVar71._4_4_;
        auVar31._8_4_ = local_12b8._4_4_ * auVar71._8_4_;
        auVar31._12_4_ = local_12b8._4_4_ * auVar71._12_4_;
        auVar52 = vfmadd231ps_fma(auVar31,auVar89,auVar52);
        auVar60 = vfmadd231ps_fma(auVar52,auVar116,auVar60);
        auVar52 = vsubps_avx(auVar39,auVar51);
        auVar77._0_4_ = auVar39._0_4_ + auVar51._0_4_;
        auVar77._4_4_ = auVar39._4_4_ + auVar51._4_4_;
        auVar77._8_4_ = auVar39._8_4_ + auVar51._8_4_;
        auVar77._12_4_ = auVar39._12_4_ + auVar51._12_4_;
        auVar51 = vsubps_avx(auVar38,auVar58);
        auVar54._0_4_ = auVar38._0_4_ + auVar58._0_4_;
        auVar54._4_4_ = auVar38._4_4_ + auVar58._4_4_;
        auVar54._8_4_ = auVar38._8_4_ + auVar58._8_4_;
        auVar54._12_4_ = auVar38._12_4_ + auVar58._12_4_;
        auVar58 = vsubps_avx(auVar50,auVar59);
        auVar40._0_4_ = auVar50._0_4_ + auVar59._0_4_;
        auVar40._4_4_ = auVar50._4_4_ + auVar59._4_4_;
        auVar40._8_4_ = auVar50._8_4_ + auVar59._8_4_;
        auVar40._12_4_ = auVar50._12_4_ + auVar59._12_4_;
        auVar73._0_4_ = auVar58._0_4_ * auVar54._0_4_;
        auVar73._4_4_ = auVar58._4_4_ * auVar54._4_4_;
        auVar73._8_4_ = auVar58._8_4_ * auVar54._8_4_;
        auVar73._12_4_ = auVar58._12_4_ * auVar54._12_4_;
        auVar38 = vfmsub231ps_fma(auVar73,auVar51,auVar40);
        auVar41._0_4_ = auVar40._0_4_ * auVar52._0_4_;
        auVar41._4_4_ = auVar40._4_4_ * auVar52._4_4_;
        auVar41._8_4_ = auVar40._8_4_ * auVar52._8_4_;
        auVar41._12_4_ = auVar40._12_4_ * auVar52._12_4_;
        auVar39 = vfmsub231ps_fma(auVar41,auVar58,auVar77);
        auVar78._0_4_ = auVar51._0_4_ * auVar77._0_4_;
        auVar78._4_4_ = auVar51._4_4_ * auVar77._4_4_;
        auVar78._8_4_ = auVar51._8_4_ * auVar77._8_4_;
        auVar78._12_4_ = auVar51._12_4_ * auVar77._12_4_;
        auVar50 = vfmsub231ps_fma(auVar78,auVar52,auVar54);
        local_12b8._0_4_ = local_12b8._4_4_;
        fStack_12b0 = local_12b8._4_4_;
        fStack_12ac = local_12b8._4_4_;
        auVar55._0_4_ = local_12b8._4_4_ * auVar50._0_4_;
        auVar55._4_4_ = local_12b8._4_4_ * auVar50._4_4_;
        auVar55._8_4_ = local_12b8._4_4_ * auVar50._8_4_;
        auVar55._12_4_ = local_12b8._4_4_ * auVar50._12_4_;
        auVar39 = vfmadd231ps_fma(auVar55,auVar89,auVar39);
        auVar50 = vfmadd231ps_fma(auVar39,auVar116,auVar38);
        auVar90._0_4_ = auVar50._0_4_ + auVar60._0_4_ + local_1098.v[0];
        auVar90._4_4_ = auVar50._4_4_ + auVar60._4_4_ + local_1098.v[1];
        auVar90._8_4_ = auVar50._8_4_ + auVar60._8_4_ + local_1098.v[2];
        auVar90._12_4_ = auVar50._12_4_ + auVar60._12_4_ + local_1098.v[3];
        auVar74._8_4_ = 0x7fffffff;
        auVar74._0_8_ = 0x7fffffff7fffffff;
        auVar74._12_4_ = 0x7fffffff;
        auVar39 = vminps_avx((undefined1  [16])local_1098,auVar60);
        auVar39 = vminps_avx(auVar39,auVar50);
        local_10a8 = vandps_avx(auVar90,auVar74);
        auVar83._0_4_ = local_10a8._0_4_ * 1.1920929e-07;
        auVar83._4_4_ = local_10a8._4_4_ * 1.1920929e-07;
        auVar83._8_4_ = local_10a8._8_4_ * 1.1920929e-07;
        auVar83._12_4_ = local_10a8._12_4_ * 1.1920929e-07;
        uVar19 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
        auVar79._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar79._8_4_ = -auVar83._8_4_;
        auVar79._12_4_ = -auVar83._12_4_;
        auVar39 = vcmpps_avx(auVar39,auVar79,5);
        auVar38 = vmaxps_avx((undefined1  [16])local_1098,auVar60);
        auVar38 = vmaxps_avx(auVar38,auVar50);
        auVar38 = vcmpps_avx(auVar38,auVar83,2);
        local_12a8 = vorps_avx(auVar39,auVar38);
        if ((((local_12a8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_12a8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_12a8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_12a8[0xf] < '\0') {
          auVar56._0_4_ = fVar96 * local_1048._0_4_;
          auVar56._4_4_ = fVar99 * local_1048._4_4_;
          auVar56._8_4_ = fVar102 * local_1048._8_4_;
          auVar56._12_4_ = fVar105 * local_1048._12_4_;
          auVar80._0_4_ = fVar95 * local_1058._0_4_;
          auVar80._4_4_ = fVar98 * local_1058._4_4_;
          auVar80._8_4_ = fVar101 * local_1058._8_4_;
          auVar80._12_4_ = fVar104 * local_1058._12_4_;
          auVar50 = vfmsub213ps_fma(local_1058,local_1078,auVar56);
          auVar84._0_4_ = auVar51._0_4_ * fVar92;
          auVar84._4_4_ = auVar51._4_4_ * fVar97;
          auVar84._8_4_ = auVar51._8_4_ * fVar100;
          auVar84._12_4_ = auVar51._12_4_ * fVar103;
          auVar42._0_4_ = fVar95 * auVar58._0_4_;
          auVar42._4_4_ = fVar98 * auVar58._4_4_;
          auVar42._8_4_ = fVar101 * auVar58._8_4_;
          auVar42._12_4_ = fVar104 * auVar58._12_4_;
          auVar58 = vfmsub213ps_fma(auVar58,local_1068,auVar84);
          auVar39 = vandps_avx(auVar56,auVar74);
          auVar38 = vandps_avx(auVar84,auVar74);
          auVar39 = vcmpps_avx(auVar39,auVar38,1);
          local_1168 = vblendvps_avx(auVar58,auVar50,auVar39);
          auVar85._0_4_ = fVar96 * auVar52._0_4_;
          auVar85._4_4_ = fVar99 * auVar52._4_4_;
          auVar85._8_4_ = fVar102 * auVar52._8_4_;
          auVar85._12_4_ = fVar105 * auVar52._12_4_;
          auVar50 = vfmsub213ps_fma(auVar52,local_1078,auVar42);
          auVar93._0_4_ = local_1038._0_4_ * fVar92;
          auVar93._4_4_ = local_1038._4_4_ * fVar97;
          auVar93._8_4_ = local_1038._8_4_ * fVar100;
          auVar93._12_4_ = local_1038._12_4_ * fVar103;
          auVar58 = vfmsub213ps_fma(local_1048,local_1088,auVar93);
          auVar39 = vandps_avx(auVar93,auVar74);
          auVar38 = vandps_avx(auVar42,auVar74);
          auVar39 = vcmpps_avx(auVar39,auVar38,1);
          local_1158 = vblendvps_avx(auVar50,auVar58,auVar39);
          auVar50 = vfmsub213ps_fma(local_1038,local_1068,auVar80);
          auVar51 = vfmsub213ps_fma(auVar51,local_1088,auVar85);
          auVar39 = vandps_avx(auVar80,auVar74);
          auVar38 = vandps_avx(auVar85,auVar74);
          auVar39 = vcmpps_avx(auVar39,auVar38,1);
          local_1148 = vblendvps_avx(auVar51,auVar50,auVar39);
          auVar43._0_4_ = local_1148._0_4_ * local_12b8._4_4_;
          auVar43._4_4_ = local_1148._4_4_ * local_12b8._4_4_;
          auVar43._8_4_ = local_1148._8_4_ * local_12b8._4_4_;
          auVar43._12_4_ = local_1148._12_4_ * local_12b8._4_4_;
          auVar39 = vfmadd213ps_fma(auVar89,local_1158,auVar43);
          auVar39 = vfmadd213ps_fma(auVar116,local_1168,auVar39);
          auVar81._0_4_ = auVar39._0_4_ + auVar39._0_4_;
          auVar81._4_4_ = auVar39._4_4_ + auVar39._4_4_;
          auVar81._8_4_ = auVar39._8_4_ + auVar39._8_4_;
          auVar81._12_4_ = auVar39._12_4_ + auVar39._12_4_;
          auVar44._0_4_ = local_1148._0_4_ * fVar108;
          auVar44._4_4_ = local_1148._4_4_ * fVar110;
          auVar44._8_4_ = local_1148._8_4_ * fVar112;
          auVar44._12_4_ = local_1148._12_4_ * fVar114;
          auVar39 = vfmadd213ps_fma(local_1018,local_1158,auVar44);
          auVar38 = vfmadd213ps_fma(auVar49,local_1168,auVar39);
          auVar39 = vrcpps_avx(auVar81);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = &DAT_3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar49 = vfnmadd213ps_fma(auVar39,auVar81,auVar94);
          auVar39 = vfmadd132ps_fma(auVar49,auVar39,auVar39);
          local_1178._0_4_ = auVar39._0_4_ * (auVar38._0_4_ + auVar38._0_4_);
          local_1178._4_4_ = auVar39._4_4_ * (auVar38._4_4_ + auVar38._4_4_);
          local_1178._8_4_ = auVar39._8_4_ * (auVar38._8_4_ + auVar38._8_4_);
          local_1178._12_4_ = auVar39._12_4_ * (auVar38._12_4_ + auVar38._12_4_);
          auVar37 = ZEXT1664(local_1178);
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar45._4_4_ = uVar16;
          auVar45._0_4_ = uVar16;
          auVar45._8_4_ = uVar16;
          auVar45._12_4_ = uVar16;
          auVar39 = vcmpps_avx(auVar45,local_1178,2);
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar86._4_4_ = uVar16;
          auVar86._0_4_ = uVar16;
          auVar86._8_4_ = uVar16;
          auVar86._12_4_ = uVar16;
          auVar38 = vcmpps_avx(local_1178,auVar86,2);
          auVar39 = vandps_avx(auVar39,auVar38);
          auVar38 = local_12a8 & auVar39;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar39 = vandps_avx(auVar39,local_12a8);
            auVar38 = vcmpps_avx(auVar81,_DAT_01feba10,4);
            auVar49 = auVar38 & auVar39;
            if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar49[0xf] < '\0') {
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar39,auVar38);
              tNear.field_0 = local_1098;
              auVar39 = vrcpps_avx(auVar90);
              auVar64._8_4_ = 0x3f800000;
              auVar64._0_8_ = &DAT_3f8000003f800000;
              auVar64._12_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(auVar90,auVar39,auVar64);
              auVar38 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
              auVar57._8_4_ = 0x219392ef;
              auVar57._0_8_ = 0x219392ef219392ef;
              auVar57._12_4_ = 0x219392ef;
              auVar39 = vcmpps_avx(local_10a8,auVar57,5);
              auVar39 = vandps_avx(auVar38,auVar39);
              auVar32._0_4_ = local_1098.v[0] * auVar39._0_4_;
              auVar32._4_4_ = local_1098.v[1] * auVar39._4_4_;
              auVar32._8_4_ = local_1098.v[2] * auVar39._8_4_;
              auVar32._12_4_ = local_1098.v[3] * auVar39._12_4_;
              local_1198 = vminps_avx(auVar32,auVar64);
              auVar33._0_4_ = auVar60._0_4_ * auVar39._0_4_;
              auVar33._4_4_ = auVar60._4_4_ * auVar39._4_4_;
              auVar33._8_4_ = auVar60._8_4_ * auVar39._8_4_;
              auVar33._12_4_ = auVar60._12_4_ * auVar39._12_4_;
              local_1188 = vminps_avx(auVar33,auVar64);
              auVar34._8_4_ = 0x7f800000;
              auVar34._0_8_ = 0x7f8000007f800000;
              auVar34._12_4_ = 0x7f800000;
              auVar39 = vblendvps_avx(auVar34,local_1178,(undefined1  [16])valid.field_0);
              auVar38 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar38 = vminps_avx(auVar38,auVar39);
              auVar49 = vshufpd_avx(auVar38,auVar38,1);
              auVar38 = vminps_avx(auVar49,auVar38);
              auVar39 = vcmpps_avx(auVar39,auVar38,0);
              auVar38 = (undefined1  [16])valid.field_0 & auVar39;
              aVar35 = valid.field_0;
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                aVar35 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vandps_avx(auVar39,(undefined1  [16])valid.field_0);
              }
              lVar24 = lVar24 + uVar27;
              uVar16 = vmovmskps_avx((undefined1  [16])aVar35);
              lVar17 = 0;
              for (uVar19 = CONCAT44((int)((ulong)&local_12e1 >> 0x20),uVar16); (uVar19 & 1) == 0;
                  uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar17 = lVar17 + 1;
              }
              local_12b8 = context->scene;
              pSVar14 = context->scene;
              do {
                uVar3 = *(uint *)(lVar24 + 0x90 + lVar17 * 4);
                pRVar13 = (RTCRayN *)(ulong)uVar3;
                pGVar5 = (pSVar14->geometries).items[(long)pRVar13].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar17] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar16 = *(undefined4 *)(local_1198 + lVar17 * 4);
                    uVar1 = *(undefined4 *)(local_1188 + lVar17 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar17 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1168 + lVar17 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1158 + lVar17 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1148 + lVar17 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar16;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar24 + 0xa0 + lVar17 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar3;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar16 = *(undefined4 *)(local_1198 + lVar17 * 4);
                  local_fd8._4_4_ = uVar16;
                  local_fd8._0_4_ = uVar16;
                  local_fd8._8_4_ = uVar16;
                  local_fd8._12_4_ = uVar16;
                  uVar16 = *(undefined4 *)(local_1188 + lVar17 * 4);
                  auVar46._4_4_ = uVar16;
                  auVar46._0_4_ = uVar16;
                  auVar46._8_4_ = uVar16;
                  auVar46._12_4_ = uVar16;
                  local_fa8._4_4_ = uVar3;
                  local_fa8._0_4_ = uVar3;
                  local_fa8._8_4_ = uVar3;
                  local_fa8._12_4_ = uVar3;
                  uVar16 = *(undefined4 *)(lVar24 + 0xa0 + lVar17 * 4);
                  auVar65._4_4_ = uVar16;
                  auVar65._0_4_ = uVar16;
                  auVar65._8_4_ = uVar16;
                  auVar65._12_4_ = uVar16;
                  uVar16 = *(undefined4 *)(local_1168 + lVar17 * 4);
                  uVar1 = *(undefined4 *)(local_1158 + lVar17 * 4);
                  local_ff8._4_4_ = uVar1;
                  local_ff8._0_4_ = uVar1;
                  local_ff8._8_4_ = uVar1;
                  local_ff8._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_1148 + lVar17 * 4);
                  local_fe8._4_4_ = uVar1;
                  local_fe8._0_4_ = uVar1;
                  local_fe8._8_4_ = uVar1;
                  local_fe8._12_4_ = uVar1;
                  local_1008[0] = (RTCHitN)(char)uVar16;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar16;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar16;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar16;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar16 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar16 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar16 >> 0x18);
                  local_fc8 = auVar46;
                  local_fb8 = auVar65;
                  vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                  uStack_f94 = context->user->instID[0];
                  local_f98 = uStack_f94;
                  uStack_f90 = uStack_f94;
                  uStack_f8c = uStack_f94;
                  uStack_f88 = context->user->instPrimID[0];
                  uStack_f84 = uStack_f88;
                  uStack_f80 = uStack_f88;
                  uStack_f7c = uStack_f88;
                  local_12a8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1178 + lVar17 * 4);
                  local_1258 = *local_1248;
                  uStack_1250 = local_1248[1];
                  args.valid = (int *)&local_1258;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  pRVar13 = (RTCRayN *)pGVar5->intersectionFilterN;
                  local_12c8 = auVar37._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar13 != (RTCRayN *)0x0) {
                    pRVar13 = (RTCRayN *)(*(code *)pRVar13)(&args);
                    auVar37._8_56_ = extraout_var;
                    auVar37._0_8_ = extraout_XMM1_Qa;
                    auVar46 = auVar37._0_16_;
                    auVar37 = ZEXT1664(local_12c8);
                    uVar18 = local_12d8;
                    uVar21 = local_12e0;
                    uVar22 = local_12d0;
                  }
                  auVar9._8_8_ = uStack_1250;
                  auVar9._0_8_ = local_1258;
                  if (auVar9 == (undefined1  [16])0x0) {
                    auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar38 = vpcmpeqd_avx(auVar46,auVar46);
                    auVar39 = auVar39 ^ auVar38;
                  }
                  else {
                    pRVar13 = (RTCRayN *)context->args->filter;
                    auVar38 = vpcmpeqd_avx(auVar65,auVar65);
                    if ((pRVar13 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar13 = (RTCRayN *)(*(code *)pRVar13)(&args);
                      auVar37 = ZEXT1664(local_12c8);
                      auVar38 = vpcmpeqd_avx(auVar38,auVar38);
                      uVar18 = local_12d8;
                      uVar21 = local_12e0;
                      uVar22 = local_12d0;
                    }
                    auVar10._8_8_ = uStack_1250;
                    auVar10._0_8_ = local_1258;
                    auVar49 = vpcmpeqd_avx(auVar10,_DAT_01feba10);
                    auVar39 = auVar49 ^ auVar38;
                    if (auVar10 != (undefined1  [16])0x0) {
                      auVar49 = auVar49 ^ auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])args.hit);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x10));
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x20));
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x30));
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x40));
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar49,*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar38;
                      pRVar13 = args.ray;
                    }
                  }
                  auVar48._8_8_ = 0x100000001;
                  auVar48._0_8_ = 0x100000001;
                  if ((auVar48 & auVar39) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_12a8._0_4_;
                  }
                  valid.field_0.v[lVar17] = 0.0;
                  uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar36._4_4_ = uVar16;
                  auVar36._0_4_ = uVar16;
                  auVar36._8_4_ = uVar16;
                  auVar36._12_4_ = uVar16;
                  auVar39 = vcmpps_avx(auVar37._0_16_,auVar36,2);
                  valid.field_0 =
                       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                       vandps_avx(auVar39,(undefined1  [16])valid.field_0);
                }
                if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0 &&
                     ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                     (undefined1  [16])0x0) &&
                    ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar39 = vblendvps_avx(auVar47,auVar37._0_16_,(undefined1  [16])valid.field_0);
                auVar38 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar38 = vminps_avx(auVar38,auVar39);
                auVar49 = vshufpd_avx(auVar38,auVar38,1);
                auVar38 = vminps_avx(auVar49,auVar38);
                auVar39 = vcmpps_avx(auVar39,auVar38,0);
                auVar38 = (undefined1  [16])valid.field_0 & auVar39;
                aVar35 = valid.field_0;
                if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar38[0xf] < '\0') {
                  aVar35.v = (__m128)vandps_avx(auVar39,valid.field_0);
                }
                uVar16 = vmovmskps_avx((undefined1  [16])aVar35);
                lVar17 = 0;
                for (uVar19 = CONCAT44((int)((ulong)pRVar13 >> 0x20),uVar16); pSVar14 = local_12b8,
                    (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  lVar17 = lVar17 + 1;
                }
              } while( true );
            }
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != uVar15 - 8);
    }
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar37 = ZEXT1664(CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,uVar16))));
    auVar87 = ZEXT1664(local_10b8);
    auVar88 = ZEXT1664(local_10c8);
    auVar91 = ZEXT1664(local_10d8);
    uVar15 = local_1238;
    uVar27 = local_1240;
    fVar92 = local_10e8;
    fVar95 = fStack_10e4;
    fVar96 = fStack_10e0;
    fVar97 = fStack_10dc;
    fVar98 = local_10f8;
    fVar99 = fStack_10f4;
    fVar100 = fStack_10f0;
    fVar101 = fStack_10ec;
    fVar102 = local_1108;
    fVar103 = fStack_1104;
    fVar104 = fStack_1100;
    fVar105 = fStack_10fc;
    fVar108 = local_1118;
    fVar110 = fStack_1114;
    fVar112 = fStack_1110;
    fVar114 = fStack_110c;
    fVar107 = local_1128;
    fVar109 = fStack_1124;
    fVar111 = fStack_1120;
    fVar113 = fStack_111c;
    fVar115 = local_1138;
    fVar117 = fStack_1134;
    fVar118 = fStack_1130;
    fVar119 = fStack_112c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }